

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O2

bool __thiscall positionTy::isNormal(positionTy *this,bool bAllowNanAltIfGnd)

{
  double dVar1;
  LTError *this_00;
  double dVar2;
  
  if (((ushort)this->f & 0xc00) != 0) {
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/CoordCalc.cpp"
                     ,0x1bb,"isNormal",logFATAL,"ASSERT FAILED: %s",
                     "f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD");
    __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
  }
  dVar2 = this->_lat;
  if (!NAN(dVar2)) {
    dVar1 = this->_lon;
    if (180.0 < dVar1) {
      return false;
    }
    if (dVar1 < -180.0) {
      return false;
    }
    if (90.0 < dVar2) {
      return false;
    }
    if (dVar2 < -90.0) {
      return false;
    }
    if (NAN(dVar1)) {
      return false;
    }
    if (NAN(this->_ts)) {
      return false;
    }
    if (((ushort)this->f & 0x300) == 0x200 && bAllowNanAltIfGnd) {
      return true;
    }
    if ((!NAN(this->_alt)) && (dVar2 = this->_alt / 0.3048, -1500.0 <= dVar2)) {
      return dVar2 <= 60000.0;
    }
  }
  return false;
}

Assistant:

bool positionTy::isNormal (bool bAllowNanAltIfGnd) const
{
    LOG_ASSERT(f.unitAngle==UNIT_DEG && f.unitCoord==UNIT_WORLD);
    return
        // should be actual numbers
        ( !std::isnan(lat()) && !std::isnan(lon()) && !std::isnan(ts())) &&
        // should normal latitudes/longitudes
        (  -90 <= lat() && lat() <=    90)  &&
        ( -180 <= lon() && lon() <=   180) &&
        // altitude can be Null - but only if on ground and specifically allowed by parameter
        ( (IsOnGnd() && bAllowNanAltIfGnd) ||
        // altitude: a 'little' below MSL might be possible (dead sea),
        //           no more than 60.000ft...we are talking planes, not rockets ;)
          (!std::isnan(alt_m()) && MDL_ALT_MIN <= alt_ft() && alt_ft() <= MDL_ALT_MAX) );
}